

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

FeatureType * __thiscall CoreML::Specification::FeatureType::New(FeatureType *this,Arena *arena)

{
  FeatureType *this_00;
  FeatureType *n;
  Arena *arena_local;
  FeatureType *this_local;
  
  this_00 = (FeatureType *)operator_new(0x28);
  FeatureType(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::FeatureType>(arena,this_00);
  }
  return this_00;
}

Assistant:

FeatureType* FeatureType::New(::google::protobuf::Arena* arena) const {
  FeatureType* n = new FeatureType;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}